

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Compare.cpp
# Opt level: O2

void __thiscall Compare::Compare(Compare *this,string *fileName)

{
  string local_30;
  
  std::__cxx11::string::string((string *)&local_30,(string *)fileName);
  GraphGenerator::GraphGenerator(&this->super_GraphGenerator,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  (this->super_GraphGenerator)._vptr_GraphGenerator = (_func_int **)&PTR_output_0012c410;
  memset(&this->timeBase,0,0x90);
  return;
}

Assistant:

Compare::Compare(string fileName): GraphGenerator(fileName) { }